

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CBufferMapRange<glcts::(anonymous_namespace)::test_api::ES3>::Run
          (CBufferMapRange<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  GLboolean GVar1;
  size_type sVar2;
  reference data;
  long lVar3;
  size_type sVar4;
  uint uVar5;
  DILogger local_19d0;
  DILogger local_1850;
  DILogger local_16d0;
  DILogger local_1550;
  DILogger local_13d0;
  DILogger local_1250;
  DILogger local_10d0;
  DILogger local_f50;
  DILogger local_dd0;
  DILogger local_c50;
  DILogger local_ad0;
  DILogger local_950;
  DILogger local_7d0;
  DILogger local_650;
  DILogger local_4d0;
  void *local_350;
  void *buf;
  uint local_1c8;
  uint local_1c4;
  int dataHeight;
  int dataWidth;
  CDataArray dataRef;
  undefined1 local_198 [8];
  DIResult result;
  CBufferMapRange<glcts::(anonymous_namespace)::test_api::ES3> *this_local;
  
  result.status_ = (long)this;
  DIResult::DIResult((DIResult *)local_198);
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             1,&this->_buffer);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,this->_buffer);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
  DrawIndirectBase::getDataSize(&this->super_DrawIndirectBase,(int *)&local_1c4,(int *)&local_1c8);
  DrawIndirectBase::DataGen<unsigned_int>
            (&this->super_DrawIndirectBase,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight,local_1c4,local_1c8,
             0x1e,0x32);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
  data = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,sVar2 << 2,data,0x88e8);
  lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
  DIResult::sub_result((DILogger *)&buf,(DIResult *)local_198,lVar3);
  DILogger::~DILogger((DILogger *)&buf);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
  local_350 = glu::CallLogWrapper::glMapBufferRange
                        (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0x8f3f,0,sVar2 << 2,1);
  if (local_350 == (void *)0x0) {
    DIResult::error(&local_4d0,(DIResult *)local_198);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_4d0,
               (char (*) [68])"glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_MAP_READ_BIT) returned NULL")
    ;
    DILogger::~DILogger(&local_4d0);
  }
  if (local_350 != (void *)0x0) {
    lVar3 = DrawIndirectBase::BufferCheck
                      (&this->super_DrawIndirectBase,(CDataArray *)&dataHeight,local_1c4,local_1c8,
                       local_350,local_1c4,local_1c8,0,0);
    DIResult::sub_result(&local_650,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_650);
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
                      (&this->super_DrawIndirectBase,'\x01',35000,1,0,sVar2 << 2);
    DIResult::sub_result(&local_7d0,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_7d0);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer
                      (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x8f3f);
    if (GVar1 == '\0') {
      DIResult::error(&local_950,(DIResult *)local_198);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_950,
                 (char (*) [75])
                 "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE");
      DILogger::~DILogger(&local_950);
    }
    local_350 = (void *)0x0;
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_ad0,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_ad0);
  }
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
  local_350 = glu::CallLogWrapper::glMapBufferRange
                        (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0x8f3f,0,sVar2 * 2 & 0xfffffffffffffffc,2);
  if (local_350 == (void *)0x0) {
    DIResult::error(&local_c50,(DIResult *)local_198);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_c50,
               (char (*) [74])
               "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL");
    DILogger::~DILogger(&local_c50);
  }
  if (local_350 != (void *)0x0) {
    lVar3 = DrawIndirectBase::BufferCheck
                      (&this->super_DrawIndirectBase,(CDataArray *)&dataHeight,local_1c4,
                       (int)local_1c8 / 2,local_350,local_1c4,(int)local_1c8 / 2,0,0);
    DIResult::sub_result(&local_dd0,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_dd0);
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
                      (&this->super_DrawIndirectBase,'\x01',0x88b9,2,0,
                       sVar2 * 2 & 0xfffffffffffffffc);
    DIResult::sub_result(&local_f50,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_f50);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer
                      (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x8f3f);
    if (GVar1 == '\0') {
      DIResult::error(&local_10d0,(DIResult *)local_198);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_10d0,
                 (char (*) [75])
                 "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE");
      DILogger::~DILogger(&local_10d0);
    }
    local_350 = (void *)0x0;
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_1250,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_1250);
  }
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
  local_350 = glu::CallLogWrapper::glMapBufferRange
                        (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0x8f3f,sVar2 & 0xfffffffffffffffc,
                         sVar4 * 2 & 0xfffffffffffffffc,2);
  if (local_350 == (void *)0x0) {
    DIResult::error(&local_13d0,(DIResult *)local_198);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_13d0,
               (char (*) [74])
               "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL");
    DILogger::~DILogger(&local_13d0);
  }
  if (local_350 != (void *)0x0) {
    uVar5 = local_1c8;
    if ((int)local_1c8 < 0) {
      uVar5 = local_1c8 + 3;
    }
    lVar3 = DrawIndirectBase::BufferCheck
                      (&this->super_DrawIndirectBase,(CDataArray *)&dataHeight,local_1c4,
                       (int)local_1c8 / 2,local_350,local_1c4,(int)local_1c8 / 2,(int)uVar5 >> 2,0);
    DIResult::sub_result(&local_1550,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_1550);
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
                      (&this->super_DrawIndirectBase,'\x01',0x88b9,2,sVar2 & 0xfffffffffffffffc,
                       sVar4 * 2 & 0xfffffffffffffffc);
    DIResult::sub_result(&local_16d0,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_16d0);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer
                      (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x8f3f);
    if (GVar1 == '\0') {
      DIResult::error(&local_1850,(DIResult *)local_198);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_1850,
                 (char (*) [75])
                 "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE");
      DILogger::~DILogger(&local_1850);
    }
    local_350 = (void *)0x0;
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_19d0,(DIResult *)local_198,lVar3);
    DILogger::~DILogger(&local_19d0);
  }
  lVar3 = DIResult::code((DIResult *)local_198);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
  DIResult::~DIResult((DIResult *)local_198);
  return lVar3;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffer);

		CDataArray dataRef;
		int		   dataWidth, dataHeight;
		getDataSize(dataWidth, dataHeight);
		DataGen<unsigned int>(dataRef, dataWidth, dataHeight, 30, 50);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)), &dataRef[0],
					 GL_DYNAMIC_DRAW);

		result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));

		void* buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)),
									 GL_MAP_READ_BIT);
		if (buf == 0)
		{
			result.error() << "glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_MAP_READ_BIT) returned NULL";
		}

		if (buf)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight, buf, dataWidth, dataHeight));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_READ_ONLY, GL_MAP_READ_BIT, 0,
												 (GLsizeiptr)(dataRef.size() * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataRef.size() / 2 * sizeof(unsigned int)),
							   GL_MAP_WRITE_BIT);
		if (buf == 0)
		{
			result.error() << "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL";
		}

		if (buf)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight / 2, buf, dataWidth, dataHeight / 2));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_WRITE_ONLY, GL_MAP_WRITE_BIT, 0,
												 (GLsizeiptr)(dataRef.size() / 2 * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, (GLintptr)(dataRef.size() / 4 * sizeof(unsigned int)),
							   (GLsizeiptr)(dataRef.size() / 2 * sizeof(unsigned int)), GL_MAP_WRITE_BIT);
		if (buf == 0)
		{
			result.error() << "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL";
		}

		if (buf)
		{
			result.sub_result(
				BufferCheck(dataRef, dataWidth, dataHeight / 2, buf, dataWidth, dataHeight / 2, dataHeight / 4));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_WRITE_ONLY, GL_MAP_WRITE_BIT,
												 (GLintptr)(dataRef.size() / 4 * sizeof(unsigned int)),
												 (GLsizeiptr)(dataRef.size() / 2 * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		return result.code();
	}